

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolutil.cpp
# Opt level: O0

UToolMemory * utm_open(char *name,int32_t initialCapacity,int32_t maxCapacity,int32_t size)

{
  UToolMemory *__dest;
  UToolMemory *mem;
  int32_t local_18;
  int32_t size_local;
  int32_t maxCapacity_local;
  int32_t initialCapacity_local;
  char *name_local;
  
  local_18 = maxCapacity;
  if (maxCapacity < initialCapacity) {
    local_18 = initialCapacity;
  }
  __dest = (UToolMemory *)uprv_malloc_63((long)(initialCapacity * size) + 0x60);
  if (__dest == (UToolMemory *)0x0) {
    fprintf(_stderr,"error: %s - out of memory\n",name);
    exit(7);
  }
  __dest->array = __dest->staticArray;
  strcpy((char *)__dest,name);
  __dest->capacity = initialCapacity;
  __dest->maxCapacity = local_18;
  __dest->size = size;
  __dest->idx = 0;
  return __dest;
}

Assistant:

U_CAPI UToolMemory * U_EXPORT2
utm_open(const char *name, int32_t initialCapacity, int32_t maxCapacity, int32_t size) {
    UToolMemory *mem;

    if(maxCapacity<initialCapacity) {
        maxCapacity=initialCapacity;
    }

    mem=(UToolMemory *)uprv_malloc(sizeof(UToolMemory)+initialCapacity*size);
    if(mem==NULL) {
        fprintf(stderr, "error: %s - out of memory\n", name);
        exit(U_MEMORY_ALLOCATION_ERROR);
    }
    mem->array=mem->staticArray;

    uprv_strcpy(mem->name, name);
    mem->capacity=initialCapacity;
    mem->maxCapacity=maxCapacity;
    mem->size=size;
    mem->idx=0;
    return mem;
}